

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::resize_bicubic(Mat *src,Mat *dst,int w,int h,Option *opt)

{
  Layer *pLVar1;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  ParamDict pd;
  Layer *interp;
  ParamDict *this;
  int in_stack_ffffffffffffffbc;
  undefined1 local_38 [8];
  ParamDict *in_stack_ffffffffffffffd0;
  
  pLVar1 = create_layer(in_stack_ffffffffffffffbc);
  this = (ParamDict *)local_38;
  ParamDict::ParamDict(in_stack_ffffffffffffffd0);
  ParamDict::set(this,0,3);
  ParamDict::set((ParamDict *)local_38,3,in_ECX);
  ParamDict::set((ParamDict *)local_38,4,in_EDX);
  (*pLVar1->_vptr_Layer[2])(pLVar1,local_38);
  (*pLVar1->_vptr_Layer[4])(pLVar1,in_R8);
  (*pLVar1->_vptr_Layer[7])(pLVar1,in_RDI,in_RSI,in_R8);
  (*pLVar1->_vptr_Layer[5])(pLVar1,in_R8);
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(this);
  return;
}

Assistant:

void resize_bicubic(const Mat& src, Mat& dst, int w, int h, const Option& opt)
{
    Layer* interp = create_layer(LayerType::Interp);

    ParamDict pd;
    pd.set(0, 3);
    pd.set(3, h);
    pd.set(4, w);

    interp->load_param(pd);

    interp->create_pipeline(opt);

    interp->forward(src, dst, opt);

    interp->destroy_pipeline(opt);

    delete interp;
}